

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar32 u_unescapeAt_63(UNESCAPE_CHAR_AT charAt,int32_t *offset,int32_t length,void *context)

{
  bool bVar1;
  sbyte sVar2;
  bool bVar3;
  UNESCAPE_CHAR_AT charAt_00;
  void *context_00;
  sbyte sVar4;
  UChar UVar5;
  uint uVar6;
  UChar32 UVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  sbyte sVar12;
  sbyte sVar13;
  int32_t ahead;
  UNESCAPE_CHAR_AT local_48;
  void *local_40;
  ulong local_38;
  
  uVar8 = *offset;
  uVar9 = (ulong)uVar8;
  if (length <= (int)uVar8 || (int)uVar8 < 0) goto LAB_002bb9c4;
  *offset = uVar8 + 1;
  UVar5 = (*charAt)(uVar8,context);
  uVar8 = (uint)(ushort)UVar5;
  local_48 = charAt;
  local_40 = context;
  local_38 = uVar9;
  if (UVar5 == L'U') {
    sVar4 = 8;
LAB_002bb896:
    bVar3 = true;
    sVar12 = sVar4;
LAB_002bb89a:
    bVar1 = false;
    sVar13 = 0;
    uVar11 = 0;
    sVar2 = 4;
  }
  else {
    uVar11 = (uint)(ushort)UVar5;
    if (uVar11 == 0x75) {
      sVar4 = 4;
      goto LAB_002bb896;
    }
    if (uVar11 == 0x78) {
      bVar3 = true;
      uVar8 = 0x78;
      bVar1 = false;
      sVar4 = 1;
      sVar12 = 2;
      if (length <= *offset) {
        sVar13 = 0;
        uVar11 = 0;
        sVar2 = 4;
        goto LAB_002bb8a4;
      }
      UVar5 = (*charAt)(*offset,context);
      if (UVar5 == L'{') {
        *offset = *offset + 1;
        bVar3 = false;
        sVar12 = 8;
      }
      goto LAB_002bb89a;
    }
    uVar6 = 0xff;
    if ((UVar5 & 0xfff8U) == 0x30) {
      uVar6 = uVar8 - 0x30 & 0xff;
    }
    if ((char)uVar6 < '\0') {
      for (uVar9 = 0; uVar9 < 0x10; uVar9 = uVar9 + 2) {
        if (UVar5 == L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar9]) {
          return (uint)(ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar9 + 1];
        }
        if ((ushort)UVar5 < (ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar9]) break;
      }
      if (UVar5 == L'c') {
        iVar10 = *offset;
        if (length <= iVar10) {
          return 99;
        }
        *offset = iVar10 + 1;
        UVar5 = (*charAt)(iVar10,context);
        uVar8 = (uint)(ushort)UVar5;
        if (((UVar5 & 0xfc00U) == 0xd800) && (*offset < length)) {
          UVar5 = (*charAt)(*offset,context);
          if ((UVar5 & 0xfc00U) == 0xdc00) {
            *offset = *offset + 1;
            uVar8 = (ushort)UVar5 + 0x2400;
          }
        }
        return uVar8 & 0x1f;
      }
      if ((UVar5 & 0xfc00U) != 0xd800) {
        return uVar11;
      }
      if (length <= *offset) {
        return uVar11;
      }
      UVar5 = (*charAt)(*offset,context);
      uVar8 = (uint)(ushort)UVar5;
      if ((uVar8 & 0xfc00) != 0xdc00) {
        return uVar11;
      }
      *offset = *offset + 1;
      goto LAB_002bba41;
    }
    bVar3 = true;
    sVar4 = 1;
    bVar1 = true;
    sVar12 = 3;
    sVar13 = 1;
    uVar11 = uVar6;
    sVar2 = sVar12;
  }
LAB_002bb8a4:
  iVar10 = *offset;
  for (; (UVar5 = (UChar)uVar8, iVar10 < length && (sVar13 < sVar12)); sVar13 = sVar13 + 1) {
    UVar5 = (*local_48)(iVar10,local_40);
    uVar8 = (uint)(ushort)UVar5;
    if (bVar1) {
      if (((UVar5 & 0xfff8U) != 0x30) || ((char)UVar5 < '0')) break;
      uVar6 = uVar8 - 0x30;
    }
    else if ((ushort)(UVar5 + L'￐') < 10) {
      uVar6 = uVar8 - 0x30;
    }
    else if ((ushort)(UVar5 + L'﾿') < 6) {
      uVar6 = uVar8 - 0x37;
    }
    else {
      if (5 < (ushort)(UVar5 + L'ﾟ')) break;
      uVar6 = uVar8 - 0x57;
    }
    uVar11 = uVar11 << sVar2 | uVar6 & 0xff;
    iVar10 = *offset + 1;
    *offset = iVar10;
  }
  context_00 = local_40;
  charAt_00 = local_48;
  uVar8 = (uint)local_38;
  if (sVar4 <= sVar13) {
    if (!bVar3) {
      if (UVar5 != L'}') goto LAB_002bb9c4;
      *offset = *offset + 1;
    }
    if (uVar11 < 0x110000) {
      iVar10 = *offset;
      if (length <= iVar10) {
        return uVar11;
      }
      if ((uVar11 & 0x1ffc00) != 0xd800) {
        return uVar11;
      }
      ahead = iVar10 + 1;
      UVar5 = (*local_48)(iVar10,local_40);
      if (iVar10 + 1 < length && UVar5 == L'\\') {
        UVar7 = u_unescapeAt_63(charAt_00,&ahead,length,context_00);
        UVar5 = (UChar)UVar7;
      }
      uVar8 = (uint)(ushort)UVar5;
      if ((UVar5 & 0xfc00U) != 0xdc00) {
        return uVar11;
      }
      *offset = ahead;
LAB_002bba41:
      return uVar11 * 0x400 + uVar8 + -0x35fdc00;
    }
  }
LAB_002bb9c4:
  *offset = uVar8;
  return -1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_unescapeAt(UNESCAPE_CHAR_AT charAt,
             int32_t *offset,
             int32_t length,
             void *context) {

    int32_t start = *offset;
    UChar c;
    UChar32 result = 0;
    int8_t n = 0;
    int8_t minDig = 0;
    int8_t maxDig = 0;
    int8_t bitsPerDigit = 4; 
    int8_t dig;
    int32_t i;
    UBool braces = FALSE;

    /* Check that offset is in range */
    if (*offset < 0 || *offset >= length) {
        goto err;
    }

    /* Fetch first UChar after '\\' */
    c = charAt((*offset)++, context);

    /* Convert hexadecimal and octal escapes */
    switch (c) {
    case 0x0075 /*'u'*/:
        minDig = maxDig = 4;
        break;
    case 0x0055 /*'U'*/:
        minDig = maxDig = 8;
        break;
    case 0x0078 /*'x'*/:
        minDig = 1;
        if (*offset < length && charAt(*offset, context) == 0x7B /*{*/) {
            ++(*offset);
            braces = TRUE;
            maxDig = 8;
        } else {
            maxDig = 2;
        }
        break;
    default:
        dig = _digit8(c);
        if (dig >= 0) {
            minDig = 1;
            maxDig = 3;
            n = 1; /* Already have first octal digit */
            bitsPerDigit = 3;
            result = dig;
        }
        break;
    }
    if (minDig != 0) {
        while (*offset < length && n < maxDig) {
            c = charAt(*offset, context);
            dig = (int8_t)((bitsPerDigit == 3) ? _digit8(c) : _digit16(c));
            if (dig < 0) {
                break;
            }
            result = (result << bitsPerDigit) | dig;
            ++(*offset);
            ++n;
        }
        if (n < minDig) {
            goto err;
        }
        if (braces) {
            if (c != 0x7D /*}*/) {
                goto err;
            }
            ++(*offset);
        }
        if (result < 0 || result >= 0x110000) {
            goto err;
        }
        /* If an escape sequence specifies a lead surrogate, see if
         * there is a trail surrogate after it, either as an escape or
         * as a literal.  If so, join them up into a supplementary.
         */
        if (*offset < length && U16_IS_LEAD(result)) {
            int32_t ahead = *offset + 1;
            c = charAt(*offset, context);
            if (c == 0x5C /*'\\'*/ && ahead < length) {
                c = (UChar) u_unescapeAt(charAt, &ahead, length, context);
            }
            if (U16_IS_TRAIL(c)) {
                *offset = ahead;
                result = U16_GET_SUPPLEMENTARY(result, c);
            }
        }
        return result;
    }

    /* Convert C-style escapes in table */
    for (i=0; i<UNESCAPE_MAP_LENGTH; i+=2) {
        if (c == UNESCAPE_MAP[i]) {
            return UNESCAPE_MAP[i+1];
        } else if (c < UNESCAPE_MAP[i]) {
            break;
        }
    }

    /* Map \cX to control-X: X & 0x1F */
    if (c == 0x0063 /*'c'*/ && *offset < length) {
        c = charAt((*offset)++, context);
        if (U16_IS_LEAD(c) && *offset < length) {
            UChar c2 = charAt(*offset, context);
            if (U16_IS_TRAIL(c2)) {
                ++(*offset);
                c = (UChar) U16_GET_SUPPLEMENTARY(c, c2); /* [sic] */
            }
        }
        return 0x1F & c;
    }

    /* If no special forms are recognized, then consider
     * the backslash to generically escape the next character.
     * Deal with surrogate pairs. */
    if (U16_IS_LEAD(c) && *offset < length) {
        UChar c2 = charAt(*offset, context);
        if (U16_IS_TRAIL(c2)) {
            ++(*offset);
            return U16_GET_SUPPLEMENTARY(c, c2);
        }
    }
    return c;

 err:
    /* Invalid escape sequence */
    *offset = start; /* Reset to initial value */
    return (UChar32)0xFFFFFFFF;
}